

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Sigmoid_x86_avx::forward_inplace(Sigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  void *pvVar3;
  int iVar4;
  undefined1 (*pauVar5) [32];
  int _c;
  int iVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  float fVar10;
  float fVar25;
  float fVar26;
  undefined1 auVar11 [16];
  float fVar27;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  Mat local_78;
  
  iVar6 = bottom_top_blob->c;
  iVar8 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar8 < 1) {
      iVar8 = _c;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; _c != iVar6; _c = _c + 1) {
      in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar5 = (undefined1 (*) [32])local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar56._16_4_ = 0x3f800000;
      auVar56._20_4_ = 0x3f800000;
      auVar56._24_4_ = 0x3f800000;
      auVar56._28_4_ = 0x3f800000;
      auVar54._8_4_ = 0xc2b0c0a5;
      auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar54._12_4_ = 0xc2b0c0a5;
      auVar54._16_4_ = 0xc2b0c0a5;
      auVar54._20_4_ = 0xc2b0c0a5;
      auVar54._24_4_ = 0xc2b0c0a5;
      auVar54._28_4_ = 0xc2b0c0a5;
      auVar51._8_4_ = 0x42b0c0a5;
      auVar51._0_8_ = 0x42b0c0a542b0c0a5;
      auVar51._12_4_ = 0x42b0c0a5;
      auVar51._16_4_ = 0x42b0c0a5;
      auVar51._20_4_ = 0x42b0c0a5;
      auVar51._24_4_ = 0x42b0c0a5;
      auVar51._28_4_ = 0x42b0c0a5;
      iVar4 = iVar8;
      while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
        auVar38 = *pauVar5;
        auVar19._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
        auVar19._8_4_ = auVar38._8_4_ ^ 0x80000000;
        auVar19._12_4_ = auVar38._12_4_ ^ 0x80000000;
        auVar19._16_4_ = auVar38._16_4_ ^ 0x80000000;
        auVar19._20_4_ = auVar38._20_4_ ^ 0x80000000;
        auVar19._24_4_ = auVar38._24_4_ ^ 0x80000000;
        auVar19._28_4_ = auVar38._28_4_ ^ 0x80000000;
        auVar38 = vminps_avx(auVar19,auVar51);
        auVar1 = vmaxps_avx(auVar38,auVar54);
        auVar38._0_4_ = auVar1._0_4_ * 1.442695 + 0.5;
        auVar38._4_4_ = auVar1._4_4_ * 1.442695 + 0.5;
        auVar38._8_4_ = auVar1._8_4_ * 1.442695 + 0.5;
        auVar38._12_4_ = auVar1._12_4_ * 1.442695 + 0.5;
        auVar38._16_4_ = auVar1._16_4_ * 1.442695 + 0.5;
        auVar38._20_4_ = auVar1._20_4_ * 1.442695 + 0.5;
        auVar38._24_4_ = auVar1._24_4_ * 1.442695 + 0.5;
        auVar38._28_4_ = in_ZMM1._28_4_ + 0.5;
        auVar19 = vroundps_avx(auVar38,1);
        auVar38 = vcmpps_avx(auVar38,auVar19,1);
        auVar38 = vandps_avx(auVar56,auVar38);
        auVar38 = vsubps_avx(auVar19,auVar38);
        fVar10 = auVar1._0_4_ + auVar38._0_4_ * -0.6931472;
        fVar25 = auVar1._4_4_ + auVar38._4_4_ * -0.6931472;
        fVar26 = auVar1._8_4_ + auVar38._8_4_ * -0.6931472;
        fVar27 = auVar1._12_4_ + auVar38._12_4_ * -0.6931472;
        fVar28 = auVar1._16_4_ + auVar38._16_4_ * -0.6931472;
        fVar29 = auVar1._20_4_ + auVar38._20_4_ * -0.6931472;
        fVar30 = auVar1._24_4_ + auVar38._24_4_ * -0.6931472;
        auVar33._0_4_ = (int)auVar38._0_4_;
        auVar33._4_4_ = (int)auVar38._4_4_;
        auVar33._8_4_ = (int)auVar38._8_4_;
        auVar33._12_4_ = (int)auVar38._12_4_;
        auVar39._16_4_ = (int)auVar38._16_4_;
        auVar39._0_16_ = auVar33;
        auVar39._20_4_ = (int)auVar38._20_4_;
        auVar39._24_4_ = (int)auVar38._24_4_;
        auVar39._28_4_ = (int)auVar38._28_4_;
        auVar45 = vpslld_avx(auVar33,0x17);
        auVar33 = vpslld_avx(auVar39._16_16_,0x17);
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar33 = vpaddd_avx(auVar33,auVar47);
        auVar45 = vpaddd_avx(auVar45,auVar47);
        auVar20._0_4_ =
             (fVar10 + 1.0 +
             fVar10 * fVar10 *
             (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
               0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar45._0_4_ + 1.0;
        auVar20._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar45._4_4_ + 1.0;
        auVar20._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar45._8_4_ + 1.0;
        auVar20._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar45._12_4_ + 1.0;
        auVar20._16_4_ =
             (fVar28 + 1.0 +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar33._0_4_ + 1.0;
        auVar20._20_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar33._4_4_ + 1.0;
        auVar20._24_4_ =
             (fVar30 + 1.0 +
             fVar30 * fVar30 *
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar33._8_4_ + 1.0;
        auVar20._28_4_ = auVar1._28_4_ + auVar19._28_4_ + 1.0 + auVar19._28_4_ + 1.0;
        auVar38 = vrcpps_avx(auVar20);
        in_ZMM1 = ZEXT3264(auVar38);
        fVar10 = auVar38._0_4_;
        fVar25 = auVar38._4_4_;
        auVar1._4_4_ = auVar20._4_4_ * fVar25;
        auVar1._0_4_ = auVar20._0_4_ * fVar10;
        fVar26 = auVar38._8_4_;
        auVar1._8_4_ = auVar20._8_4_ * fVar26;
        fVar27 = auVar38._12_4_;
        auVar1._12_4_ = auVar20._12_4_ * fVar27;
        fVar28 = auVar38._16_4_;
        auVar1._16_4_ = auVar20._16_4_ * fVar28;
        fVar29 = auVar38._20_4_;
        auVar1._20_4_ = auVar20._20_4_ * fVar29;
        fVar30 = auVar38._24_4_;
        auVar1._24_4_ = auVar20._24_4_ * fVar30;
        auVar1._28_4_ = auVar20._28_4_;
        auVar1 = vsubps_avx(auVar56,auVar1);
        auVar21._0_4_ = fVar10 + fVar10 * auVar1._0_4_;
        auVar21._4_4_ = fVar25 + fVar25 * auVar1._4_4_;
        auVar21._8_4_ = fVar26 + fVar26 * auVar1._8_4_;
        auVar21._12_4_ = fVar27 + fVar27 * auVar1._12_4_;
        auVar21._16_4_ = fVar28 + fVar28 * auVar1._16_4_;
        auVar21._20_4_ = fVar29 + fVar29 * auVar1._20_4_;
        auVar21._24_4_ = fVar30 + fVar30 * auVar1._24_4_;
        auVar21._28_4_ = auVar38._28_4_ + auVar1._28_4_;
        *pauVar5 = auVar21;
        pauVar5 = pauVar5 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar8 < 1) {
      iVar8 = _c;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; _c != iVar6; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar5 = (undefined1 (*) [32])local_78.data;
      ncnn::Mat::~Mat(&local_78);
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = 0x3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      auVar53._8_4_ = 0xc2b0c0a5;
      auVar53._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar53._12_4_ = 0xc2b0c0a5;
      auVar50._8_4_ = 0x42b0c0a5;
      auVar50._0_8_ = 0x42b0c0a542b0c0a5;
      auVar50._12_4_ = 0x42b0c0a5;
      iVar4 = iVar8;
      while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
        auVar33 = *(undefined1 (*) [16])*pauVar5;
        auVar11._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
        auVar11._8_4_ = auVar33._8_4_ ^ 0x80000000;
        auVar11._12_4_ = auVar33._12_4_ ^ 0x80000000;
        auVar33 = vminps_avx(auVar11,auVar50);
        auVar47 = vmaxps_avx(auVar33,auVar53);
        auVar31._0_4_ = auVar47._0_4_ * 1.442695 + 0.5;
        auVar31._4_4_ = auVar47._4_4_ * 1.442695 + 0.5;
        auVar31._8_4_ = auVar47._8_4_ * 1.442695 + 0.5;
        auVar31._12_4_ = auVar47._12_4_ * 1.442695 + 0.5;
        auVar44._0_4_ = (int)auVar31._0_4_;
        auVar44._4_4_ = (int)auVar31._4_4_;
        auVar44._8_4_ = (int)auVar31._8_4_;
        auVar44._12_4_ = (int)auVar31._12_4_;
        auVar45 = vcvtdq2ps_avx(auVar44);
        auVar33 = vcmpps_avx(auVar31,auVar45,1);
        auVar33 = vandps_avx(auVar55,auVar33);
        auVar33 = vsubps_avx(auVar45,auVar33);
        fVar10 = auVar47._0_4_ + auVar33._0_4_ * -0.6931472;
        fVar25 = auVar47._4_4_ + auVar33._4_4_ * -0.6931472;
        fVar26 = auVar47._8_4_ + auVar33._8_4_ * -0.6931472;
        fVar27 = auVar47._12_4_ + auVar33._12_4_ * -0.6931472;
        auVar32._0_4_ = (int)auVar33._0_4_;
        auVar32._4_4_ = (int)auVar33._4_4_;
        auVar32._8_4_ = (int)auVar33._8_4_;
        auVar32._12_4_ = (int)auVar33._12_4_;
        auVar33 = vpslld_avx(auVar32,0x17);
        auVar33 = vpaddd_avx(auVar55,auVar33);
        auVar12._0_4_ =
             (fVar10 + 1.0 +
             fVar10 * fVar10 *
             (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
               0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar33._0_4_ + 1.0;
        auVar12._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar33._4_4_ + 1.0;
        auVar12._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar33._8_4_ + 1.0;
        auVar12._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar33._12_4_ + 1.0;
        auVar33 = vrcpps_avx(auVar12);
        fVar10 = auVar33._0_4_;
        auVar13._0_4_ = auVar12._0_4_ * fVar10;
        fVar25 = auVar33._4_4_;
        auVar13._4_4_ = auVar12._4_4_ * fVar25;
        fVar26 = auVar33._8_4_;
        auVar13._8_4_ = auVar12._8_4_ * fVar26;
        fVar27 = auVar33._12_4_;
        auVar13._12_4_ = auVar12._12_4_ * fVar27;
        auVar33 = vsubps_avx(auVar55,auVar13);
        auVar14._0_4_ = fVar10 + fVar10 * auVar33._0_4_;
        auVar14._4_4_ = fVar25 + fVar25 * auVar33._4_4_;
        auVar14._8_4_ = fVar26 + fVar26 * auVar33._8_4_;
        auVar14._12_4_ = fVar27 + fVar27 * auVar33._12_4_;
        *(undefined1 (*) [16])*pauVar5 = auVar14;
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
      }
    }
  }
  else {
    if (iVar6 < 1) {
      iVar6 = _c;
    }
    for (; _c != iVar6; _c = _c + 1) {
      ncnn::Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar3 = local_78.data;
      ncnn::Mat::~Mat(&local_78);
      lVar7 = 0;
      pauVar5 = (undefined1 (*) [32])pvVar3;
      for (iVar4 = 0; iVar4 + 7 < iVar8; iVar4 = iVar4 + 8) {
        auVar51 = *pauVar5;
        auVar22._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
        auVar22._8_4_ = auVar51._8_4_ ^ 0x80000000;
        auVar22._12_4_ = auVar51._12_4_ ^ 0x80000000;
        auVar22._16_4_ = auVar51._16_4_ ^ 0x80000000;
        auVar22._20_4_ = auVar51._20_4_ ^ 0x80000000;
        auVar22._24_4_ = auVar51._24_4_ ^ 0x80000000;
        auVar22._28_4_ = auVar51._28_4_ ^ 0x80000000;
        auVar40._8_4_ = 0x42b0c0a5;
        auVar40._0_8_ = 0x42b0c0a542b0c0a5;
        auVar40._12_4_ = 0x42b0c0a5;
        auVar40._16_4_ = 0x42b0c0a5;
        auVar40._20_4_ = 0x42b0c0a5;
        auVar40._24_4_ = 0x42b0c0a5;
        auVar40._28_4_ = 0x42b0c0a5;
        auVar51 = vminps_avx(auVar22,auVar40);
        auVar41._8_4_ = 0xc2b0c0a5;
        auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._12_4_ = 0xc2b0c0a5;
        auVar41._16_4_ = 0xc2b0c0a5;
        auVar41._20_4_ = 0xc2b0c0a5;
        auVar41._24_4_ = 0xc2b0c0a5;
        auVar41._28_4_ = 0xc2b0c0a5;
        auVar54 = vmaxps_avx(auVar51,auVar41);
        auVar42._0_4_ = auVar54._0_4_ * 1.442695 + 0.5;
        auVar42._4_4_ = auVar54._4_4_ * 1.442695 + 0.5;
        auVar42._8_4_ = auVar54._8_4_ * 1.442695 + 0.5;
        auVar42._12_4_ = auVar54._12_4_ * 1.442695 + 0.5;
        auVar42._16_4_ = auVar54._16_4_ * 1.442695 + 0.5;
        auVar42._20_4_ = auVar54._20_4_ * 1.442695 + 0.5;
        auVar42._24_4_ = auVar54._24_4_ * 1.442695 + 0.5;
        auVar42._28_4_ = 0x3ff8aa3b;
        auVar56 = vroundps_avx(auVar42,1);
        auVar51 = vcmpps_avx(auVar42,auVar56,1);
        auVar52._8_4_ = 0x3f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._12_4_ = 0x3f800000;
        auVar52._16_4_ = 0x3f800000;
        auVar52._20_4_ = 0x3f800000;
        auVar52._24_4_ = 0x3f800000;
        auVar52._28_4_ = 0x3f800000;
        auVar51 = vandps_avx(auVar51,auVar52);
        auVar51 = vsubps_avx(auVar56,auVar51);
        fVar10 = auVar54._0_4_ + auVar51._0_4_ * -0.6931472;
        fVar25 = auVar54._4_4_ + auVar51._4_4_ * -0.6931472;
        fVar26 = auVar54._8_4_ + auVar51._8_4_ * -0.6931472;
        fVar27 = auVar54._12_4_ + auVar51._12_4_ * -0.6931472;
        fVar28 = auVar54._16_4_ + auVar51._16_4_ * -0.6931472;
        fVar29 = auVar54._20_4_ + auVar51._20_4_ * -0.6931472;
        fVar30 = auVar54._24_4_ + auVar51._24_4_ * -0.6931472;
        auVar45._0_4_ = (int)auVar51._0_4_;
        auVar45._4_4_ = (int)auVar51._4_4_;
        auVar45._8_4_ = (int)auVar51._8_4_;
        auVar45._12_4_ = (int)auVar51._12_4_;
        auVar43._16_4_ = (int)auVar51._16_4_;
        auVar43._0_16_ = auVar45;
        auVar43._20_4_ = (int)auVar51._20_4_;
        auVar43._24_4_ = (int)auVar51._24_4_;
        auVar43._28_4_ = (int)auVar51._28_4_;
        auVar45 = vpslld_avx(auVar45,0x17);
        auVar33 = vpslld_avx(auVar43._16_16_,0x17);
        auVar48._8_4_ = 0x3f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._12_4_ = 0x3f800000;
        auVar33 = vpaddd_avx(auVar33,auVar48);
        auVar45 = vpaddd_avx(auVar45,auVar48);
        auVar23._0_4_ =
             (fVar10 + 1.0 +
             fVar10 * fVar10 *
             (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
               0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar45._0_4_ + 1.0;
        auVar23._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar45._4_4_ + 1.0;
        auVar23._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar45._8_4_ + 1.0;
        auVar23._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar45._12_4_ + 1.0;
        auVar23._16_4_ =
             (fVar28 + 1.0 +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar33._0_4_ + 1.0;
        auVar23._20_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar33._4_4_ + 1.0;
        auVar23._24_4_ =
             (fVar30 + 1.0 +
             fVar30 * fVar30 *
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar33._8_4_ + 1.0;
        auVar23._28_4_ = auVar54._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
        auVar51 = vrcpps_avx(auVar23);
        fVar10 = auVar51._0_4_;
        fVar25 = auVar51._4_4_;
        auVar2._4_4_ = auVar23._4_4_ * fVar25;
        auVar2._0_4_ = auVar23._0_4_ * fVar10;
        fVar26 = auVar51._8_4_;
        auVar2._8_4_ = auVar23._8_4_ * fVar26;
        fVar27 = auVar51._12_4_;
        auVar2._12_4_ = auVar23._12_4_ * fVar27;
        fVar28 = auVar51._16_4_;
        auVar2._16_4_ = auVar23._16_4_ * fVar28;
        fVar29 = auVar51._20_4_;
        auVar2._20_4_ = auVar23._20_4_ * fVar29;
        fVar30 = auVar51._24_4_;
        auVar2._24_4_ = auVar23._24_4_ * fVar30;
        auVar2._28_4_ = auVar23._28_4_;
        auVar54 = vsubps_avx(auVar52,auVar2);
        auVar24._0_4_ = fVar10 + fVar10 * auVar54._0_4_;
        auVar24._4_4_ = fVar25 + fVar25 * auVar54._4_4_;
        auVar24._8_4_ = fVar26 + fVar26 * auVar54._8_4_;
        auVar24._12_4_ = fVar27 + fVar27 * auVar54._12_4_;
        auVar24._16_4_ = fVar28 + fVar28 * auVar54._16_4_;
        auVar24._20_4_ = fVar29 + fVar29 * auVar54._20_4_;
        auVar24._24_4_ = fVar30 + fVar30 * auVar54._24_4_;
        auVar24._28_4_ = auVar51._28_4_ + auVar54._28_4_;
        *pauVar5 = auVar24;
        pauVar5 = pauVar5 + 1;
        lVar7 = lVar7 + 8;
      }
      for (; iVar4 + 3 < iVar8; iVar4 = iVar4 + 4) {
        auVar33 = *(undefined1 (*) [16])*pauVar5;
        auVar15._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
        auVar15._8_4_ = auVar33._8_4_ ^ 0x80000000;
        auVar15._12_4_ = auVar33._12_4_ ^ 0x80000000;
        auVar34._8_4_ = 0x42b0c0a5;
        auVar34._0_8_ = 0x42b0c0a542b0c0a5;
        auVar34._12_4_ = 0x42b0c0a5;
        auVar33 = vminps_avx(auVar15,auVar34);
        auVar35._8_4_ = 0xc2b0c0a5;
        auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar35._12_4_ = 0xc2b0c0a5;
        auVar47 = vmaxps_avx(auVar33,auVar35);
        auVar36._0_4_ = auVar47._0_4_ * 1.442695 + 0.5;
        auVar36._4_4_ = auVar47._4_4_ * 1.442695 + 0.5;
        auVar36._8_4_ = auVar47._8_4_ * 1.442695 + 0.5;
        auVar36._12_4_ = auVar47._12_4_ * 1.442695 + 0.5;
        auVar46._0_4_ = (int)auVar36._0_4_;
        auVar46._4_4_ = (int)auVar36._4_4_;
        auVar46._8_4_ = (int)auVar36._8_4_;
        auVar46._12_4_ = (int)auVar36._12_4_;
        auVar45 = vcvtdq2ps_avx(auVar46);
        auVar33 = vcmpps_avx(auVar36,auVar45,1);
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        auVar33 = vandps_avx(auVar33,auVar49);
        auVar33 = vsubps_avx(auVar45,auVar33);
        fVar10 = auVar47._0_4_ + auVar33._0_4_ * -0.6931472;
        fVar25 = auVar47._4_4_ + auVar33._4_4_ * -0.6931472;
        fVar26 = auVar47._8_4_ + auVar33._8_4_ * -0.6931472;
        fVar27 = auVar47._12_4_ + auVar33._12_4_ * -0.6931472;
        auVar37._0_4_ = (int)auVar33._0_4_;
        auVar37._4_4_ = (int)auVar33._4_4_;
        auVar37._8_4_ = (int)auVar33._8_4_;
        auVar37._12_4_ = (int)auVar33._12_4_;
        auVar33 = vpslld_avx(auVar37,0x17);
        auVar33 = vpaddd_avx(auVar33,auVar49);
        auVar16._0_4_ =
             (fVar10 + 1.0 +
             fVar10 * fVar10 *
             (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
               0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar33._0_4_ + 1.0;
        auVar16._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar33._4_4_ + 1.0;
        auVar16._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar33._8_4_ + 1.0;
        auVar16._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar33._12_4_ + 1.0;
        auVar33 = vrcpps_avx(auVar16);
        fVar10 = auVar33._0_4_;
        auVar17._0_4_ = auVar16._0_4_ * fVar10;
        fVar25 = auVar33._4_4_;
        auVar17._4_4_ = auVar16._4_4_ * fVar25;
        fVar26 = auVar33._8_4_;
        auVar17._8_4_ = auVar16._8_4_ * fVar26;
        fVar27 = auVar33._12_4_;
        auVar17._12_4_ = auVar16._12_4_ * fVar27;
        auVar33 = vsubps_avx(auVar49,auVar17);
        auVar18._0_4_ = fVar10 + fVar10 * auVar33._0_4_;
        auVar18._4_4_ = fVar25 + fVar25 * auVar33._4_4_;
        auVar18._8_4_ = fVar26 + fVar26 * auVar33._8_4_;
        auVar18._12_4_ = fVar27 + fVar27 * auVar33._12_4_;
        *(undefined1 (*) [16])*pauVar5 = auVar18;
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
        lVar7 = lVar7 + 4;
      }
      for (; (int)lVar7 < iVar8; lVar7 = lVar7 + 1) {
        fVar10 = expf(-*(float *)((undefined1 *)pvVar3 + lVar7 * 4));
        *(float *)((undefined1 *)pvVar3 + lVar7 * 4) = 1.0 / (fVar10 + 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, sigmoid_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, sigmoid_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, sigmoid_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, sigmoid_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));

            ptr++;
        }
    }

    return 0;
}